

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_acid_vein(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  OBJ_DATA *obj;
  CHAR_DATA *in_RDX;
  undefined2 in_SI;
  undefined2 in_DI;
  OBJ_AFFECT_DATA oaf;
  OBJ_DATA *weapon;
  char arg [4608];
  OBJ_AFFECT_DATA *in_stack_ffffffffffffed78;
  OBJ_DATA *in_stack_ffffffffffffed80;
  CHAR_DATA *in_stack_ffffffffffffed88;
  undefined2 in_stack_ffffffffffffed90;
  undefined2 in_stack_ffffffffffffed92;
  undefined2 uVar2;
  undefined2 in_stack_ffffffffffffed94;
  undefined2 in_stack_ffffffffffffed96;
  CHAR_DATA *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  CHAR_DATA *in_stack_ffffffffffffff98;
  
  target_name = one_argument((char *)in_stack_ffffffffffffed80,(char *)in_stack_ffffffffffffed78);
  obj = get_obj_carry(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88)
  ;
  if (obj == (OBJ_DATA *)0x0) {
    send_to_char((char *)CONCAT26(in_stack_ffffffffffffed96,
                                  CONCAT24(in_stack_ffffffffffffed94,
                                           CONCAT22(in_stack_ffffffffffffed92,
                                                    in_stack_ffffffffffffed90))),
                 in_stack_ffffffffffffed88);
  }
  else if (obj->item_type == 5) {
    bVar1 = is_affected_obj(obj,(int)gsn_acid_vein);
    if (bVar1) {
      send_to_char((char *)CONCAT26(in_stack_ffffffffffffed96,
                                    CONCAT24(in_stack_ffffffffffffed94,
                                             CONCAT22(in_stack_ffffffffffffed92,
                                                      in_stack_ffffffffffffed90))),
                   in_stack_ffffffffffffed88);
    }
    else {
      init_affect_obj((OBJ_AFFECT_DATA *)0x6e09e5);
      uVar2 = 0;
      affect_to_obj(in_stack_ffffffffffffed80,in_stack_ffffffffffffed78);
      act((char *)CONCAT26(in_SI,CONCAT24(in_DI,CONCAT22(uVar2,in_stack_ffffffffffffed90))),in_RDX,
          in_stack_ffffffffffffed80,in_stack_ffffffffffffed78,0);
      WAIT_STATE((CHAR_DATA *)
                 CONCAT26(in_SI,CONCAT24(in_DI,CONCAT22(uVar2,in_stack_ffffffffffffed90))),
                 (int)((ulong)in_RDX >> 0x20));
    }
  }
  else {
    send_to_char((char *)CONCAT26(in_stack_ffffffffffffed96,
                                  CONCAT24(in_stack_ffffffffffffed94,
                                           CONCAT22(in_stack_ffffffffffffed92,
                                                    in_stack_ffffffffffffed90))),
                 in_stack_ffffffffffffed88);
  }
  return;
}

Assistant:

void spell_acid_vein(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	char arg[MSL];
	OBJ_DATA *weapon;
	OBJ_AFFECT_DATA oaf;

	target_name = one_argument(target_name, arg);

	weapon = get_obj_carry(ch, arg, ch);

	if (weapon == nullptr)
	{
		send_to_char("You aren't carrying that.\n\r", ch);
		return;
	}

	if (weapon->item_type != ITEM_WEAPON)
	{
		send_to_char("You can only cast this on weapons.\n\r", ch);
		return;
	}

	if (is_affected_obj(weapon, gsn_acid_vein))
	{
		send_to_char("This weapon is already coated with acid!\n\r", ch);
		return;
	}

	init_affect_obj(&oaf);
	oaf.where = TO_OBJ_AFFECTS;
	oaf.type = sn;
	oaf.aftype = AFT_SPELL;
	oaf.location = APPLY_OBJ_V3;
	oaf.modifier = 31 - weapon->value[3];
	oaf.duration = level * 3;
	oaf.end_fun = acid_end;
	oaf.level = level;
	oaf.owner = ch;
	affect_to_obj(weapon, &oaf);

	act("You coat $p with acid.", ch, weapon, 0, TO_CHAR);
	WAIT_STATE(ch, PULSE_VIOLENCE * 2);
}